

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlSchemaXPathProcessHistory(xmlSchemaValidCtxtPtr vctxt,int depth)

{
  int iVar1;
  xmlSchemaIDCMatcherPtr_conflict pxVar2;
  xmlSchemaIDCPtr_conflict pxVar3;
  xmlSchemaNodeInfoPtr pxVar4;
  xmlSchemaItemListPtr list;
  uint uVar5;
  int iVar6;
  xmlSchemaPSVIIDCKeyPtr **pppxVar7;
  xmlSchemaPSVIIDCNodePtr pxVar8;
  xmlChar *pxVar9;
  xmlSchemaPSVIIDCKeyPtr *__s;
  xmlSchemaPSVIIDCKeyPtr pxVar10;
  xmlSchemaPSVIIDCKeyPtr *ppxVar11;
  xmlSchemaPSVIIDCNodePtr *ppxVar12;
  xmlHashTablePtr pxVar13;
  undefined8 *userdata;
  undefined8 *puVar14;
  xmlChar *pxVar15;
  xmlSchemaTypePtr pxVar16;
  xmlSchemaTypePtr pxVar17;
  char *in_R8;
  char *pcVar18;
  int iVar19;
  long lVar20;
  xmlSchemaIDCStateObjPtr_conflict pxVar21;
  xmlSchemaIDCStateObjPtr pxVar22;
  long lVar23;
  xmlSchemaTypePtr pxVar24;
  xmlChar *local_80;
  xmlSchemaTypePtr local_78;
  xmlChar *local_70;
  xmlSchemaPSVIIDCNodePtr local_68;
  xmlSchemaTypePtr local_60;
  xmlSchemaItemListPtr local_58;
  xmlSchemaIDCPtr_conflict local_50;
  xmlSchemaPSVIIDCKeyPtr local_48;
  xmlChar *local_40;
  long local_38;
  
  if (vctxt->xpathStates != (xmlSchemaIDCStateObjPtr_conflict)0x0) {
    pxVar24 = vctxt->inode->typeDef;
    local_38 = (long)depth;
    local_48 = (xmlSchemaPSVIIDCKeyPtr)0x0;
    pxVar21 = vctxt->xpathStates;
    do {
      iVar6 = xmlStreamPop((xmlStreamCtxtPtr)pxVar21->xpathCtxt);
      if (iVar6 == -1) {
        pcVar18 = "calling xmlStreamPop()";
LAB_001cd4fe:
        xmlSchemaInternalErr2
                  ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaXPathProcessHistory",pcVar18,
                   (xmlChar *)0x0,(xmlChar *)in_R8);
        return -1;
      }
      if ((long)pxVar21->nbHistory == 0) {
LAB_001cd3f0:
        if (pxVar21->depth != depth) goto LAB_001cca9b;
        if (vctxt->xpathStates != pxVar21) {
          xmlSchemaInternalErr2
                    ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaXPathProcessHistory",
                     "The state object to be removed is not the first in the list",(xmlChar *)0x0,
                     (xmlChar *)in_R8);
        }
        pxVar22 = pxVar21->next;
        vctxt->xpathStates = pxVar22;
        pxVar21->next = vctxt->xpathStatePool;
        vctxt->xpathStatePool = pxVar21;
      }
      else {
        if (pxVar21->history[(long)pxVar21->nbHistory + -1] == depth) {
          if (pxVar21->type == 1) {
            pxVar2 = pxVar21->matcher;
            pxVar3 = pxVar2->aidc->def;
            if ((pxVar2->keySeqs == (xmlSchemaPSVIIDCKeyPtr **)0x0) ||
               (lVar20 = local_38 - pxVar2->depth, pxVar2->sizeKeySeqs <= (int)lVar20)) {
              if (pxVar3->type == XML_SCHEMA_TYPE_IDC_KEY) {
                pppxVar7 = (xmlSchemaPSVIIDCKeyPtr **)0x0;
LAB_001ccdfa:
                local_80 = (xmlChar *)0x0;
                local_78 = pxVar24;
                pxVar15 = xmlSchemaGetComponentDesignation(&local_80,pxVar3);
                in_R8 = "Not all fields of %s evaluate to a node";
                xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_CVC_IDC,
                                    (xmlNodePtr)0x0,(xmlSchemaBasicItemPtr)pxVar3,
                                    "Not all fields of %s evaluate to a node",pxVar15,(xmlChar *)0x0
                                    ,(xmlChar *)0x0,(xmlChar *)0x0);
                pxVar24 = local_78;
                if (local_80 != (xmlChar *)0x0) {
                  (*xmlFree)(local_80);
                  pxVar24 = local_78;
                }
LAB_001cce51:
                if (pppxVar7 != (xmlSchemaPSVIIDCKeyPtr **)0x0) {
LAB_001cd3b0:
                  if (*pppxVar7 != (xmlSchemaPSVIIDCKeyPtr *)0x0) {
                    (*xmlFree)(*pppxVar7);
                    *pppxVar7 = (xmlSchemaPSVIIDCKeyPtr *)0x0;
                  }
                }
              }
            }
            else {
              pppxVar7 = pxVar2->keySeqs + lVar20;
              if (*pppxVar7 != (xmlSchemaPSVIIDCKeyPtr *)0x0) {
                pxVar16 = (xmlSchemaTypePtr)(ulong)(uint)pxVar3->nbFields;
                if (0 < pxVar3->nbFields) {
                  pxVar17 = (xmlSchemaTypePtr)0x0;
                  do {
                    if ((*pppxVar7)[(long)pxVar17] == (xmlSchemaPSVIIDCKeyPtr)0x0) {
                      if (pxVar3->type == XML_SCHEMA_TYPE_IDC_KEY) goto LAB_001ccdfa;
                      goto LAB_001cce51;
                    }
                    pxVar17 = (xmlSchemaTypePtr)((long)&pxVar17->type + 1);
                  } while (pxVar16 != pxVar17);
                }
                local_58 = pxVar2->targets;
                local_60 = pxVar16;
                local_50 = pxVar3;
                if (local_58 == (xmlSchemaItemListPtr)0x0) {
                  local_58 = xmlSchemaItemListCreate();
                  pxVar2->targets = local_58;
                }
                local_78 = pxVar24;
                if (((local_50->type != XML_SCHEMA_TYPE_IDC_KEYREF) && (local_58->nbItems != 0)) &&
                   (pxVar2->htab != (xmlHashTablePtr)0x0)) {
                  local_80 = (xmlChar *)0x0;
                  in_R8 = &DAT_00000001;
                  xmlSchemaFormatIDCKeySequence_1(vctxt,&local_80,*pppxVar7,(int)local_60,1);
                  pxVar15 = local_80;
                  local_70 = (xmlChar *)xmlHashLookup(pxVar2->htab,local_80);
                  if (pxVar15 != (xmlChar *)0x0) {
                    (*xmlFree)(pxVar15);
                  }
                  for (; local_70 != (xmlChar *)0x0; local_70 = *(xmlChar **)local_70) {
                    if (0 < (int)local_60) {
                      local_68 = *(xmlSchemaPSVIIDCNodePtr *)
                                  ((long)local_58->items[*(int *)(local_70 + 8)] + 8);
                      pxVar24 = (xmlSchemaTypePtr)0x0;
                      while( true ) {
                        iVar6 = xmlSchemaAreValuesEqual
                                          ((*pppxVar7)[(long)pxVar24]->val,
                                           *(xmlSchemaValPtr *)
                                            &(&local_68->node)[(long)pxVar24]->type);
                        if (iVar6 == -1) {
                          return -1;
                        }
                        if (iVar6 == 0) break;
                        pxVar24 = (xmlSchemaTypePtr)((long)&pxVar24->type + 1);
                        if (local_60 == pxVar24) {
                          local_80 = (xmlChar *)0x0;
                          local_40 = (xmlChar *)0x0;
                          pxVar15 = xmlSchemaFormatIDCKeySequence_1
                                              (vctxt,&local_80,*pppxVar7,(int)local_60,0);
                          pxVar3 = local_50;
                          pxVar9 = xmlSchemaGetComponentDesignation(&local_40,local_50);
                          in_R8 = "Duplicate key-sequence %s in %s";
                          xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_CVC_IDC,
                                              (xmlNodePtr)0x0,(xmlSchemaBasicItemPtr)pxVar3,
                                              "Duplicate key-sequence %s in %s",pxVar15,pxVar9,
                                              (xmlChar *)0x0,(xmlChar *)0x0);
                          if (local_80 != (xmlChar *)0x0) {
                            (*xmlFree)(local_80);
                          }
                          pxVar24 = local_78;
                          if (local_40 != (xmlChar *)0x0) {
                            (*xmlFree)(local_40);
                          }
                          goto LAB_001cd3b0;
                        }
                      }
                    }
                    pxVar24 = local_78;
                  }
                }
                pxVar8 = (xmlSchemaPSVIIDCNodePtr)(*xmlMalloc)(0x18);
                if (pxVar8 == (xmlSchemaPSVIIDCNodePtr)0x0) {
                  __xmlSimpleError(0x11,2,(xmlNodePtr)0x0,(char *)0x0,
                                   "allocating an IDC node-table item");
                }
                else {
                  pxVar8->node = (xmlNodePtr)0x0;
                  pxVar8->keys = (xmlSchemaPSVIIDCKeyPtr *)0x0;
                  pxVar8->nodeLine = 0;
                  pxVar8->nodeQNameID = 0;
                  local_68 = pxVar8;
                  if (local_50->type != XML_SCHEMA_TYPE_IDC_KEYREF) {
                    ppxVar12 = vctxt->idcNodes;
                    if (ppxVar12 == (xmlSchemaPSVIIDCNodePtr *)0x0) {
                      ppxVar12 = (xmlSchemaPSVIIDCNodePtr *)(*xmlMalloc)(0xa0);
                      vctxt->idcNodes = ppxVar12;
                      if (ppxVar12 == (xmlSchemaPSVIIDCNodePtr *)0x0) {
                        pcVar18 = "allocating the IDC node table item list";
LAB_001cd670:
                        vctxt->nberrors = vctxt->nberrors + 1;
                        vctxt->err = 0x71a;
                        __xmlSimpleError(0x11,2,(xmlNodePtr)0x0,(char *)0x0,pcVar18);
                        (*xmlFree)(pxVar8);
                        (*xmlFree)(*pppxVar7);
                        goto LAB_001cd607;
                      }
                      vctxt->sizeIdcNodes = 0x14;
                    }
                    else {
                      iVar6 = vctxt->sizeIdcNodes;
                      if (iVar6 <= vctxt->nbIdcNodes) {
                        vctxt->sizeIdcNodes = iVar6 * 2;
                        ppxVar12 = (xmlSchemaPSVIIDCNodePtr *)
                                   (*xmlRealloc)(ppxVar12,(long)iVar6 << 4);
                        vctxt->idcNodes = ppxVar12;
                        if (ppxVar12 == (xmlSchemaPSVIIDCNodePtr *)0x0) {
                          pcVar18 = "re-allocating the IDC node table item list";
                          goto LAB_001cd670;
                        }
                      }
                    }
                    iVar6 = vctxt->nbIdcNodes;
                    vctxt->nbIdcNodes = iVar6 + 1;
                    ppxVar12[iVar6] = pxVar8;
                    lVar20 = 0xffffffff;
LAB_001cd224:
                    pxVar8->nodeQNameID = (int)lVar20;
LAB_001cd2a1:
                    pxVar8->node = vctxt->node;
                    pxVar8->nodeLine = vctxt->inode->nodeLine;
                    pxVar8->keys = *pppxVar7;
                    *pppxVar7 = (xmlSchemaPSVIIDCKeyPtr *)0x0;
                    iVar6 = xmlSchemaItemListAdd(local_58,pxVar8);
                    pxVar8 = local_68;
                    if (iVar6 == -1) {
                      if (local_50->type == XML_SCHEMA_TYPE_IDC_KEYREF) {
                        (*xmlFree)(local_68->keys);
                        (*xmlFree)(pxVar8);
                        return -1;
                      }
                      return -1;
                    }
                    if (local_50->type != XML_SCHEMA_TYPE_IDC_KEYREF) {
                      local_80 = (xmlChar *)0x0;
                      if (pxVar2->htab == (xmlHashTablePtr)0x0) {
                        pxVar13 = xmlHashCreate(4);
                        pxVar2->htab = pxVar13;
                      }
                      in_R8 = &DAT_00000001;
                      xmlSchemaFormatIDCKeySequence_1
                                (vctxt,&local_80,local_68->keys,(int)local_60,1);
                      userdata = (undefined8 *)(*xmlMalloc)(0x10);
                      pxVar15 = local_80;
                      *(int *)(userdata + 1) = local_58->nbItems + -1;
                      puVar14 = (undefined8 *)xmlHashLookup(pxVar2->htab,local_80);
                      if (puVar14 == (undefined8 *)0x0) {
                        *userdata = 0;
                        xmlHashAddEntry(pxVar2->htab,pxVar15,userdata);
                      }
                      else {
                        *userdata = *puVar14;
                        *puVar14 = userdata;
                      }
                      pxVar24 = local_78;
                      if (pxVar15 != (xmlChar *)0x0) {
                        (*xmlFree)(pxVar15);
                        pxVar24 = local_78;
                      }
                    }
                    goto LAB_001cd3b0;
                  }
                  local_70 = vctxt->inode->nsName;
                  pxVar15 = xmlDictLookup(vctxt->dict,vctxt->inode->localName,-1);
                  if (pxVar15 == (xmlChar *)0x0) {
LAB_001cd5e1:
                    local_68->nodeQNameID = -1;
                  }
                  else {
                    if (local_70 == (xmlChar *)0x0) {
                      pxVar9 = (xmlChar *)0x0;
                    }
                    else {
                      pxVar9 = xmlDictLookup(vctxt->dict,local_70,-1);
                      if (pxVar9 == (xmlChar *)0x0) goto LAB_001cd5e1;
                    }
                    list = vctxt->nodeQNames;
                    iVar6 = list->nbItems;
                    if (0 < iVar6) {
                      lVar20 = 0;
                      do {
                        if (((xmlChar *)list->items[lVar20] == pxVar15) &&
                           (pxVar8 = local_68, pxVar24 = local_78,
                           (xmlChar *)list->items[lVar20 + 1] == pxVar9)) goto LAB_001cd224;
                        lVar20 = lVar20 + 2;
                      } while ((int)lVar20 < iVar6);
                    }
                    local_70 = pxVar9;
                    xmlSchemaItemListAdd(list,pxVar15);
                    xmlSchemaItemListAdd(vctxt->nodeQNames,local_70);
                    local_68->nodeQNameID = iVar6;
                    pxVar8 = local_68;
                    pxVar24 = local_78;
                    if (iVar6 != -1) goto LAB_001cd2a1;
                  }
                  (*xmlFree)(local_68);
                }
                (*xmlFree)(*pppxVar7);
LAB_001cd607:
                *pppxVar7 = (xmlSchemaPSVIIDCKeyPtr *)0x0;
                return -1;
              }
              if (pxVar3->type == XML_SCHEMA_TYPE_IDC_KEY) goto LAB_001ccdfa;
            }
LAB_001cd3de:
            iVar6 = pxVar21->nbHistory + -1;
            pxVar21->nbHistory = iVar6;
          }
          else {
            if (pxVar21->type != 2) goto LAB_001cd3de;
            if ((pxVar24->type == XML_SCHEMA_TYPE_COMPLEX) ||
               (pxVar16 = pxVar24, pxVar24->builtInType == 0x2d)) {
              if ((pxVar24->contentType | XML_SCHEMA_CONTENT_ELEMENTS) == XML_SCHEMA_CONTENT_BASIC)
              {
                pxVar16 = pxVar24->contentTypeDef;
                if (pxVar16 == (xmlSchemaTypePtr)0x0) {
                  pcVar18 = 
                  "field resolves to a CT with simple content but the CT is missing the ST definition"
                  ;
                  goto LAB_001cd4fe;
                }
                goto LAB_001ccaf1;
              }
              local_80 = (xmlChar *)0x0;
              pxVar3 = pxVar21->matcher->aidc->def;
              pxVar15 = pxVar21->sel->xpath;
              local_78 = pxVar24;
              pxVar9 = xmlSchemaGetComponentDesignation(&local_80,pxVar3);
              in_R8 = "The XPath \'%s\' of a field of %s does evaluate to a node of non-simple type"
              ;
              xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_CVC_IDC,
                                  (xmlNodePtr)0x0,(xmlSchemaBasicItemPtr)pxVar3,
                                  "The XPath \'%s\' of a field of %s does evaluate to a node of non-simple type"
                                  ,pxVar15,pxVar9,(xmlChar *)0x0,(xmlChar *)0x0);
joined_r0x001ccec5:
              if (local_80 != (xmlChar *)0x0) {
                (*xmlFree)(local_80);
              }
              iVar6 = pxVar21->nbHistory + -1;
              pxVar21->nbHistory = iVar6;
              pxVar24 = local_78;
            }
            else {
LAB_001ccaf1:
              if ((local_48 != (xmlSchemaPSVIIDCKeyPtr)0x0) ||
                 (vctxt->inode->val != (xmlSchemaValPtr)0x0)) {
                pxVar2 = pxVar21->matcher;
                lVar20 = (long)pxVar21->depth - (long)pxVar2->depth;
                iVar6 = pxVar21->sel->index;
                iVar19 = (int)lVar20;
                local_60 = pxVar16;
                if (pxVar2->keySeqs == (xmlSchemaPSVIIDCKeyPtr **)0x0) {
                  uVar5 = iVar19 * 2;
                  if (iVar19 < 10) {
                    uVar5 = 10;
                  }
                  pxVar2->sizeKeySeqs = uVar5;
                  local_78 = pxVar24;
                  pppxVar7 = (xmlSchemaPSVIIDCKeyPtr **)(*xmlMalloc)((ulong)uVar5 << 3);
                  pxVar2->keySeqs = pppxVar7;
                  if (pppxVar7 == (xmlSchemaPSVIIDCKeyPtr **)0x0) {
                    pcVar18 = "allocating an array of key-sequences";
                    goto LAB_001cd549;
                  }
                  memset(pppxVar7,0,(long)pxVar2->sizeKeySeqs << 3);
                }
                else {
                  iVar1 = pxVar2->sizeKeySeqs;
                  lVar23 = (long)iVar1;
                  local_78 = pxVar24;
                  if (iVar1 <= iVar19) {
                    pxVar2->sizeKeySeqs = iVar1 * 2;
                    pppxVar7 = (xmlSchemaPSVIIDCKeyPtr **)(*xmlRealloc)(pxVar2->keySeqs,lVar23 << 4)
                    ;
                    pxVar2->keySeqs = pppxVar7;
                    if (pppxVar7 == (xmlSchemaPSVIIDCKeyPtr **)0x0) {
                      pcVar18 = "reallocating an array of key-sequences";
                      goto LAB_001cd549;
                    }
                    iVar19 = pxVar2->sizeKeySeqs;
                    if (iVar1 < iVar19) {
                      do {
                        pxVar2->keySeqs[lVar23] = (xmlSchemaPSVIIDCKeyPtr *)0x0;
                        lVar23 = lVar23 + 1;
                      } while (iVar19 != lVar23);
                    }
                  }
                }
                __s = pxVar2->keySeqs[lVar20];
                if (__s == (xmlSchemaPSVIIDCKeyPtr *)0x0) {
                  __s = (xmlSchemaPSVIIDCKeyPtr *)
                        (*xmlMalloc)((long)pxVar2->aidc->def->nbFields << 3);
                  if (__s == (xmlSchemaPSVIIDCKeyPtr *)0x0) {
                    pcVar18 = "allocating an IDC key-sequence";
LAB_001cd549:
                    __xmlSimpleError(0x11,2,(xmlNodePtr)0x0,(char *)0x0,pcVar18);
                    return -1;
                  }
                  memset(__s,0,(long)pxVar2->aidc->def->nbFields << 3);
                  pxVar2->keySeqs[lVar20] = __s;
                }
                else if (__s[iVar6] != (xmlSchemaPSVIIDCKeyPtr)0x0) {
                  local_80 = (xmlChar *)0x0;
                  pxVar3 = pxVar2->aidc->def;
                  pxVar15 = pxVar21->sel->xpath;
                  pxVar9 = xmlSchemaGetComponentDesignation(&local_80,pxVar3);
                  in_R8 = 
                  "The XPath \'%s\' of a field of %s evaluates to a node-set with more than one member"
                  ;
                  xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_CVC_IDC,
                                      (xmlNodePtr)0x0,(xmlSchemaBasicItemPtr)pxVar3,
                                      "The XPath \'%s\' of a field of %s evaluates to a node-set with more than one member"
                                      ,pxVar15,pxVar9,(xmlChar *)0x0,(xmlChar *)0x0);
                  goto joined_r0x001ccec5;
                }
                pxVar10 = local_48;
                if (local_48 == (xmlSchemaPSVIIDCKeyPtr)0x0) {
                  pxVar10 = (xmlSchemaPSVIIDCKeyPtr)(*xmlMalloc)(0x10);
                  if (pxVar10 == (xmlSchemaPSVIIDCKeyPtr)0x0) {
                    __xmlSimpleError(0x11,2,(xmlNodePtr)0x0,(char *)0x0,"allocating a IDC key");
                    (*xmlFree)(__s);
                    pxVar2->keySeqs[lVar20] = (xmlSchemaPSVIIDCKeyPtr *)0x0;
                    return -1;
                  }
                  pxVar10->type = local_60;
                  pxVar4 = vctxt->inode;
                  pxVar10->val = pxVar4->val;
                  pxVar4->val = (xmlSchemaValPtr)0x0;
                  ppxVar11 = vctxt->idcKeys;
                  if (ppxVar11 == (xmlSchemaPSVIIDCKeyPtr *)0x0) {
                    ppxVar11 = (xmlSchemaPSVIIDCKeyPtr *)(*xmlMalloc)(0x140);
                    vctxt->idcKeys = ppxVar11;
                    if (ppxVar11 == (xmlSchemaPSVIIDCKeyPtr *)0x0) {
                      pcVar18 = "allocating the IDC key storage list";
LAB_001cd623:
                      vctxt->nberrors = vctxt->nberrors + 1;
                      vctxt->err = 0x71a;
                      __xmlSimpleError(0x11,2,(xmlNodePtr)0x0,(char *)0x0,pcVar18);
                      if (pxVar10->val != (xmlSchemaValPtr)0x0) {
                        xmlSchemaFreeValue(pxVar10->val);
                      }
                      (*xmlFree)(pxVar10);
                      return -1;
                    }
                    vctxt->sizeIdcKeys = 0x28;
                  }
                  else {
                    iVar19 = vctxt->sizeIdcKeys;
                    if (iVar19 <= vctxt->nbIdcKeys) {
                      vctxt->sizeIdcKeys = iVar19 * 2;
                      ppxVar11 = (xmlSchemaPSVIIDCKeyPtr *)(*xmlRealloc)(ppxVar11,(long)iVar19 << 4)
                      ;
                      vctxt->idcKeys = ppxVar11;
                      if (ppxVar11 == (xmlSchemaPSVIIDCKeyPtr *)0x0) {
                        pcVar18 = "re-allocating the IDC key storage list";
                        goto LAB_001cd623;
                      }
                    }
                  }
                  iVar19 = vctxt->nbIdcKeys;
                  vctxt->nbIdcKeys = iVar19 + 1;
                  ppxVar11[iVar19] = pxVar10;
                }
                __s[iVar6] = pxVar10;
                pxVar24 = local_78;
                local_48 = pxVar10;
                goto LAB_001cd3de;
              }
              in_R8 = 
              "Warning: No precomputed value available, the value was either invalid or something strange happened"
              ;
              xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_CVC_IDC,
                                  (xmlNodePtr)0x0,(xmlSchemaBasicItemPtr)pxVar21->matcher->aidc->def
                                  ,
                                  "Warning: No precomputed value available, the value was either invalid or something strange happened"
                                  ,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
              iVar6 = pxVar21->nbHistory + -1;
              pxVar21->nbHistory = iVar6;
              local_48 = (xmlSchemaPSVIIDCKeyPtr)0x0;
            }
          }
          if (iVar6 == 0) goto LAB_001cd3f0;
        }
LAB_001cca9b:
        pxVar22 = pxVar21->next;
      }
      pxVar21 = pxVar22;
    } while (pxVar22 != (xmlSchemaIDCStateObjPtr)0x0);
  }
  return 0;
}

Assistant:

static int
xmlSchemaXPathProcessHistory(xmlSchemaValidCtxtPtr vctxt,
			     int depth)
{
    xmlSchemaIDCStateObjPtr sto, nextsto;
    int res, matchDepth;
    xmlSchemaPSVIIDCKeyPtr key = NULL;
    xmlSchemaTypePtr type = vctxt->inode->typeDef, simpleType = NULL;

    if (vctxt->xpathStates == NULL)
	return (0);
    sto = vctxt->xpathStates;

#ifdef DEBUG_IDC
    {
	xmlChar *str = NULL;
	xmlGenericError(xmlGenericErrorContext,
	    "IDC: BACK on %s, depth %d\n",
	    xmlSchemaFormatQName(&str, vctxt->inode->nsName,
		vctxt->inode->localName), vctxt->depth);
	FREE_AND_NULL(str)
    }
#endif
    /*
    * Evaluate the state objects.
    */
    while (sto != NULL) {
	res = xmlStreamPop((xmlStreamCtxtPtr) sto->xpathCtxt);
	if (res == -1) {
	    VERROR_INT("xmlSchemaXPathProcessHistory",
		"calling xmlStreamPop()");
	    return (-1);
	}
#ifdef DEBUG_IDC
	xmlGenericError(xmlGenericErrorContext, "IDC:   stream pop '%s'\n",
	    sto->sel->xpath);
#endif
	if (sto->nbHistory == 0)
	    goto deregister_check;

	matchDepth = sto->history[sto->nbHistory -1];

	/*
	* Only matches at the current depth are of interest.
	*/
	if (matchDepth != depth) {
	    sto = sto->next;
	    continue;
	}
	if (sto->type == XPATH_STATE_OBJ_TYPE_IDC_FIELD) {
	    /*
	    * NOTE: According to
	    *   http://www.w3.org/Bugs/Public/show_bug.cgi?id=2198
	    *   ... the simple-content of complex types is also allowed.
	    */

	    if (WXS_IS_COMPLEX(type)) {
		if (WXS_HAS_SIMPLE_CONTENT(type)) {
		    /*
		    * Sanity check for complex types with simple content.
		    */
		    simpleType = type->contentTypeDef;
		    if (simpleType == NULL) {
			VERROR_INT("xmlSchemaXPathProcessHistory",
			    "field resolves to a CT with simple content "
			    "but the CT is missing the ST definition");
			return (-1);
		    }
		} else
		    simpleType = NULL;
	    } else
		simpleType = type;
	    if (simpleType == NULL) {
		xmlChar *str = NULL;

		/*
		* Not qualified if the field resolves to a node of non
		* simple type.
		*/
		xmlSchemaCustomErr(ACTXT_CAST vctxt,
		    XML_SCHEMAV_CVC_IDC, NULL,
		    WXS_BASIC_CAST sto->matcher->aidc->def,
		    "The XPath '%s' of a field of %s does evaluate to a node of "
		    "non-simple type",
		    sto->sel->xpath,
		    xmlSchemaGetIDCDesignation(&str, sto->matcher->aidc->def));
		FREE_AND_NULL(str);
		sto->nbHistory--;
		goto deregister_check;
	    }

	    if ((key == NULL) && (vctxt->inode->val == NULL)) {
		/*
		* Failed to provide the normalized value; maybe
		* the value was invalid.
		*/
		VERROR(XML_SCHEMAV_CVC_IDC,
		    WXS_BASIC_CAST sto->matcher->aidc->def,
		    "Warning: No precomputed value available, the value "
		    "was either invalid or something strange happened");
		sto->nbHistory--;
		goto deregister_check;
	    } else {
		xmlSchemaIDCMatcherPtr matcher = sto->matcher;
		xmlSchemaPSVIIDCKeyPtr *keySeq;
		int pos, idx;

		/*
		* The key will be anchored on the matcher's list of
		* key-sequences. The position in this list is determined
		* by the target node's depth relative to the matcher's
		* depth of creation (i.e. the depth of the scope element).
		*
		* Element        Depth    Pos   List-entries
		* <scope>          0              NULL
		*   <bar>          1              NULL
		*     <target/>    2       2      target
		*   <bar>
                * </scope>
		*
		* The size of the list is only dependent on the depth of
		* the tree.
		* An entry will be NULLed in selector_leave, i.e. when
		* we hit the target's
		*/
		pos = sto->depth - matcher->depth;
		idx = sto->sel->index;

		/*
		* Create/grow the array of key-sequences.
		*/
		if (matcher->keySeqs == NULL) {
		    if (pos > 9)
			matcher->sizeKeySeqs = pos * 2;
		    else
			matcher->sizeKeySeqs = 10;
		    matcher->keySeqs = (xmlSchemaPSVIIDCKeyPtr **)
			xmlMalloc(matcher->sizeKeySeqs *
			sizeof(xmlSchemaPSVIIDCKeyPtr *));
		    if (matcher->keySeqs == NULL) {
			xmlSchemaVErrMemory(NULL,
			    "allocating an array of key-sequences",
			    NULL);
			return(-1);
		    }
		    memset(matcher->keySeqs, 0,
			matcher->sizeKeySeqs *
			sizeof(xmlSchemaPSVIIDCKeyPtr *));
		} else if (pos >= matcher->sizeKeySeqs) {
		    int i = matcher->sizeKeySeqs;

		    matcher->sizeKeySeqs *= 2;
		    matcher->keySeqs = (xmlSchemaPSVIIDCKeyPtr **)
			xmlRealloc(matcher->keySeqs,
			matcher->sizeKeySeqs *
			sizeof(xmlSchemaPSVIIDCKeyPtr *));
		    if (matcher->keySeqs == NULL) {
			xmlSchemaVErrMemory(NULL,
			    "reallocating an array of key-sequences",
			    NULL);
			return (-1);
		    }
		    /*
		    * The array needs to be NULLed.
		    * TODO: Use memset?
		    */
		    for (; i < matcher->sizeKeySeqs; i++)
			matcher->keySeqs[i] = NULL;
		}

		/*
		* Get/create the key-sequence.
		*/
		keySeq = matcher->keySeqs[pos];
		if (keySeq == NULL) {
		    goto create_sequence;
		} else if (keySeq[idx] != NULL) {
		    xmlChar *str = NULL;
		    /*
		    * cvc-identity-constraint:
		    * 3 For each node in the `target node set` all
		    * of the {fields}, with that node as the context
		    * node, evaluate to either an empty node-set or
		    * a node-set with exactly one member, which must
		    * have a simple type.
		    *
		    * The key was already set; report an error.
		    */
		    xmlSchemaCustomErr(ACTXT_CAST vctxt,
			XML_SCHEMAV_CVC_IDC, NULL,
			WXS_BASIC_CAST matcher->aidc->def,
			"The XPath '%s' of a field of %s evaluates to a "
			"node-set with more than one member",
			sto->sel->xpath,
			xmlSchemaGetIDCDesignation(&str, matcher->aidc->def));
		    FREE_AND_NULL(str);
		    sto->nbHistory--;
		    goto deregister_check;
		} else
		    goto create_key;

create_sequence:
		/*
		* Create a key-sequence.
		*/
		keySeq = (xmlSchemaPSVIIDCKeyPtr *) xmlMalloc(
		    matcher->aidc->def->nbFields *
		    sizeof(xmlSchemaPSVIIDCKeyPtr));
		if (keySeq == NULL) {
		    xmlSchemaVErrMemory(NULL,
			"allocating an IDC key-sequence", NULL);
		    return(-1);
		}
		memset(keySeq, 0, matcher->aidc->def->nbFields *
		    sizeof(xmlSchemaPSVIIDCKeyPtr));
		matcher->keySeqs[pos] = keySeq;
create_key:
		/*
		* Create a key once per node only.
		*/
		if (key == NULL) {
		    key = (xmlSchemaPSVIIDCKeyPtr) xmlMalloc(
			sizeof(xmlSchemaPSVIIDCKey));
		    if (key == NULL) {
			xmlSchemaVErrMemory(NULL,
			    "allocating a IDC key", NULL);
			xmlFree(keySeq);
			matcher->keySeqs[pos] = NULL;
			return(-1);
		    }
		    /*
		    * Consume the compiled value.
		    */
		    key->type = simpleType;
		    key->val = vctxt->inode->val;
		    vctxt->inode->val = NULL;
		    /*
		    * Store the key in a global list.
		    */
		    if (xmlSchemaIDCStoreKey(vctxt, key) == -1) {
			xmlSchemaIDCFreeKey(key);
			return (-1);
		    }
		}
		keySeq[idx] = key;
	    }
	} else if (sto->type == XPATH_STATE_OBJ_TYPE_IDC_SELECTOR) {

	    xmlSchemaPSVIIDCKeyPtr **keySeq = NULL;
	    /* xmlSchemaPSVIIDCBindingPtr bind; */
	    xmlSchemaPSVIIDCNodePtr ntItem;
	    xmlSchemaIDCMatcherPtr matcher;
	    xmlSchemaIDCPtr idc;
	    xmlSchemaItemListPtr targets;
	    int pos, i, j, nbKeys;
	    /*
	    * Here we have the following scenario:
	    * An IDC 'selector' state object resolved to a target node,
	    * during the time this target node was in the
	    * ancestor-or-self axis, the 'field' state object(s) looked
	    * out for matching nodes to create a key-sequence for this
	    * target node. Now we are back to this target node and need
	    * to put the key-sequence, together with the target node
	    * itself, into the node-table of the corresponding IDC
	    * binding.
	    */
	    matcher = sto->matcher;
	    idc = matcher->aidc->def;
	    nbKeys = idc->nbFields;
	    pos = depth - matcher->depth;
	    /*
	    * Check if the matcher has any key-sequences at all, plus
	    * if it has a key-sequence for the current target node.
	    */
	    if ((matcher->keySeqs == NULL) ||
		(matcher->sizeKeySeqs <= pos)) {
		if (idc->type == XML_SCHEMA_TYPE_IDC_KEY)
		    goto selector_key_error;
		else
		    goto selector_leave;
	    }

	    keySeq = &(matcher->keySeqs[pos]);
	    if (*keySeq == NULL) {
		if (idc->type == XML_SCHEMA_TYPE_IDC_KEY)
		    goto selector_key_error;
		else
		    goto selector_leave;
	    }

	    for (i = 0; i < nbKeys; i++) {
		if ((*keySeq)[i] == NULL) {
		    /*
		    * Not qualified, if not all fields did resolve.
		    */
		    if (idc->type == XML_SCHEMA_TYPE_IDC_KEY) {
			/*
			* All fields of a "key" IDC must resolve.
			*/
			goto selector_key_error;
		    }
		    goto selector_leave;
		}
	    }
	    /*
	    * All fields did resolve.
	    */

	    /*
	    * 4.1 If the {identity-constraint category} is unique(/key),
	    * then no two members of the `qualified node set` have
	    * `key-sequences` whose members are pairwise equal, as
	    * defined by Equal in [XML Schemas: Datatypes].
	    *
	    * Get the IDC binding from the matcher and check for
	    * duplicate key-sequences.
	    */
#if 0
	    bind = xmlSchemaIDCAcquireBinding(vctxt, matcher);
#endif
	    targets = xmlSchemaIDCAcquireTargetList(vctxt, matcher);
	    if ((idc->type != XML_SCHEMA_TYPE_IDC_KEYREF) &&
		(targets->nbItems != 0)) {
		xmlSchemaPSVIIDCKeyPtr ckey, bkey, *bkeySeq;
		xmlIDCHashEntryPtr e;

		res = 0;

		if (!matcher->htab)
		    e = NULL;
		else {
		    xmlChar *value = NULL;
		    xmlSchemaHashKeySequence(vctxt, &value, *keySeq, nbKeys);
		    e = xmlHashLookup(matcher->htab, value);
		    FREE_AND_NULL(value);
		}

		/*
		* Compare the key-sequences, key by key.
		*/
		for (;e; e = e->next) {
		    bkeySeq =
			((xmlSchemaPSVIIDCNodePtr) targets->items[e->index])->keys;
		    for (j = 0; j < nbKeys; j++) {
			ckey = (*keySeq)[j];
			bkey = bkeySeq[j];
			res = xmlSchemaAreValuesEqual(ckey->val, bkey->val);
			if (res == -1) {
			    return (-1);
			} else if (res == 0) {
			    /*
			    * One of the keys differs, so the key-sequence
			    * won't be equal; get out.
			    */
			    break;
			}
		    }
		    if (res == 1) {
			/*
			* Duplicate key-sequence found.
			*/
			break;
		    }
		}
		if (e) {
		    xmlChar *str = NULL, *strB = NULL;
		    /*
		    * TODO: Try to report the key-sequence.
		    */
		    xmlSchemaCustomErr(ACTXT_CAST vctxt,
			XML_SCHEMAV_CVC_IDC, NULL,
			WXS_BASIC_CAST idc,
			"Duplicate key-sequence %s in %s",
			xmlSchemaFormatIDCKeySequence(vctxt, &str,
			    (*keySeq), nbKeys),
			xmlSchemaGetIDCDesignation(&strB, idc));
		    FREE_AND_NULL(str);
		    FREE_AND_NULL(strB);
		    goto selector_leave;
		}
	    }
	    /*
	    * Add a node-table item to the IDC binding.
	    */
	    ntItem = (xmlSchemaPSVIIDCNodePtr) xmlMalloc(
		sizeof(xmlSchemaPSVIIDCNode));
	    if (ntItem == NULL) {
		xmlSchemaVErrMemory(NULL,
		    "allocating an IDC node-table item", NULL);
		xmlFree(*keySeq);
		*keySeq = NULL;
		return(-1);
	    }
	    memset(ntItem, 0, sizeof(xmlSchemaPSVIIDCNode));

	    /*
	    * Store the node-table item in a global list.
	    */
	    if (idc->type != XML_SCHEMA_TYPE_IDC_KEYREF) {
		if (xmlSchemaIDCStoreNodeTableItem(vctxt, ntItem) == -1) {
		    xmlFree(ntItem);
		    xmlFree(*keySeq);
		    *keySeq = NULL;
		    return (-1);
		}
		ntItem->nodeQNameID = -1;
	    } else {
		/*
		* Save a cached QName for this node on the IDC node, to be
		* able to report it, even if the node is not saved.
		*/
		ntItem->nodeQNameID = xmlSchemaVAddNodeQName(vctxt,
		    vctxt->inode->localName, vctxt->inode->nsName);
		if (ntItem->nodeQNameID == -1) {
		    xmlFree(ntItem);
		    xmlFree(*keySeq);
		    *keySeq = NULL;
		    return (-1);
		}
	    }
	    /*
	    * Init the node-table item: Save the node, position and
	    * consume the key-sequence.
	    */
	    ntItem->node = vctxt->node;
	    ntItem->nodeLine = vctxt->inode->nodeLine;
	    ntItem->keys = *keySeq;
	    *keySeq = NULL;
#if 0
	    if (xmlSchemaIDCAppendNodeTableItem(bind, ntItem) == -1)
#endif
	    if (xmlSchemaItemListAdd(targets, ntItem) == -1) {
		if (idc->type == XML_SCHEMA_TYPE_IDC_KEYREF) {
		    /*
		    * Free the item, since keyref items won't be
		    * put on a global list.
		    */
		    xmlFree(ntItem->keys);
		    xmlFree(ntItem);
		}
		return (-1);
	    }
	    if (idc->type != XML_SCHEMA_TYPE_IDC_KEYREF) {
		xmlChar *value = NULL;
		xmlIDCHashEntryPtr r, e;
		if (!matcher->htab)
		  matcher->htab = xmlHashCreate(4);
		xmlSchemaHashKeySequence(vctxt, &value, ntItem->keys, nbKeys);
		e = xmlMalloc(sizeof *e);
		e->index = targets->nbItems - 1;
		r = xmlHashLookup(matcher->htab, value);
		if (r) {
		    e->next = r->next;
		    r->next = e;
		} else {
		    e->next = NULL;
		    xmlHashAddEntry(matcher->htab, value, e);
		}
		FREE_AND_NULL(value);
	    }

	    goto selector_leave;
selector_key_error:
	    {
		xmlChar *str = NULL;
		/*
		* 4.2.1 (KEY) The `target node set` and the
		* `qualified node set` are equal, that is, every
		* member of the `target node set` is also a member
		* of the `qualified node set` and vice versa.
		*/
		xmlSchemaCustomErr(ACTXT_CAST vctxt,
		    XML_SCHEMAV_CVC_IDC, NULL,
		    WXS_BASIC_CAST idc,
		    "Not all fields of %s evaluate to a node",
		    xmlSchemaGetIDCDesignation(&str, idc), NULL);
		FREE_AND_NULL(str);
	    }
selector_leave:
	    /*
	    * Free the key-sequence if not added to the IDC table.
	    */
	    if ((keySeq != NULL) && (*keySeq != NULL)) {
		xmlFree(*keySeq);
		*keySeq = NULL;
	    }
	} /* if selector */

	sto->nbHistory--;

deregister_check:
	/*
	* Deregister state objects if they reach the depth of creation.
	*/
	if ((sto->nbHistory == 0) && (sto->depth == depth)) {
#ifdef DEBUG_IDC
	    xmlGenericError(xmlGenericErrorContext, "IDC:   STO pop '%s'\n",
		sto->sel->xpath);
#endif
	    if (vctxt->xpathStates != sto) {
		VERROR_INT("xmlSchemaXPathProcessHistory",
		    "The state object to be removed is not the first "
		    "in the list");
	    }
	    nextsto = sto->next;
	    /*
	    * Unlink from the list of active XPath state objects.
	    */
	    vctxt->xpathStates = sto->next;
	    sto->next = vctxt->xpathStatePool;
	    /*
	    * Link it to the pool of reusable state objects.
	    */
	    vctxt->xpathStatePool = sto;
	    sto = nextsto;
	} else
	    sto = sto->next;
    } /* while (sto != NULL) */
    return (0);
}